

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markethandler.h
# Opt level: O0

void __thiscall
hedg::Market_Handler::update_traded
          (Market_Handler *this,string *market_id,int runner_id,optional<float> ltp,
          optional<float> traded_volume,Bid *bid)

{
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *pmVar1;
  reference this_02;
  pointer this_03;
  Bid *bid_local;
  string *psStack_28;
  int runner_id_local;
  string *market_id_local;
  Market_Handler *this_local;
  optional<float> traded_volume_local;
  optional<float> ltp_local;
  
  bid_local._4_4_ = runner_id;
  psStack_28 = market_id;
  market_id_local = (string *)this;
  this_local = (Market_Handler *)
               traded_volume.super__Optional_base<float,_true,_true>._M_payload.
               super__Optional_payload_base<float>;
  traded_volume_local = ltp;
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>_>_>_>
            ::operator[](&this->traded,market_id);
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
            ::operator[](&this->runner_loc,market_id);
  pmVar1 = std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::operator[](this_01,(key_type *)((long)&bid_local + 4));
  this_02 = std::
            vector<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>,_std::allocator<std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>_>_>
            ::operator[](this_00,(long)*pmVar1);
  this_03 = std::unique_ptr<hedg::Traded_Book,_std::default_delete<hedg::Traded_Book>_>::operator->
                      (this_02);
  Traded_Book::update(this_03,traded_volume_local,(optional<float>)this_local,bid);
  return;
}

Assistant:

void update_traded(std::string market_id, int runner_id, std::optional<float> ltp, std::optional<float> traded_volume, Bid& bid) {
		traded[market_id][runner_loc[market_id][runner_id]]->update(ltp, traded_volume,bid);
	}